

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest::InflateAndCheck
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ZLIBBufferCompressorTest *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *input_buffer,ByteBuffer *compressed
          )

{
  long lVar1;
  uchar *__first;
  char *message;
  AssertHelper AStack_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertionResult gtest_ar;
  ByteBuffer decompressed;
  ZLIBBufferInflator decompressor;
  
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(&decompressor);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(&decompressed);
  lVar1 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  __first = (uchar *)bidfx_public_api::tools::ByteBuffer::ToArray();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             __first + lVar1,(allocator_type *)&gtest_ar);
  operator_delete(__first,1);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar,"input_buffer","result_vector",input_buffer,
             __return_storage_ptr__);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&decompressed);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(&decompressor);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> ZLIBBufferCompressorTest::InflateAndCheck(std::vector<unsigned char>& input_buffer,
                                                                     bidfx_public_api::tools::ByteBuffer& compressed)
{
    ZLIBBufferInflator decompressor;
    ByteBuffer decompressed = decompressor.Inflate(compressed);
    size_t num_bytes = decompressed.ReadableBytes();
    unsigned char* result_array = decompressed.ToArray();
    std::vector<unsigned char> result_vector = std::vector<unsigned char>(result_array, result_array + num_bytes);
    delete result_array;
    EXPECT_EQ(input_buffer, result_vector);
    return result_vector;
}